

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::flush_undeclared_variables(CompilerGLSL *this,SPIRBlock *block)

{
  size_t sVar1;
  TypedID<(spirv_cross::Types)2> *pTVar2;
  long lVar3;
  
  sVar1 = (block->dominated_variables).
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size;
  if (sVar1 != 0) {
    pTVar2 = (block->dominated_variables).
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr;
    lVar3 = 0;
    do {
      flush_variable_declaration(this,*(uint32_t *)((long)&pTVar2->id + lVar3));
      lVar3 = lVar3 + 4;
    } while (sVar1 << 2 != lVar3);
  }
  return;
}

Assistant:

static bool packing_is_scalar(BufferPackingStandard packing)
{
	switch (packing)
	{
	case BufferPackingScalar:
	case BufferPackingScalarEnhancedLayout:
		return true;

	default:
		return false;
	}
}